

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O3

void __thiscall
cuckoocache_tests::EraseParallelTest::
test_cache_erase_parallel<CuckooCache::cache<uint256,SignatureCacheHasher>>
          (EraseParallelTest *this,size_t megabytes)

{
  pointer puVar1;
  uchar *puVar2;
  uchar *puVar3;
  uint256 e;
  uint256 e_00;
  undefined1 auVar4 [16];
  pointer ptVar5;
  undefined8 uVar6;
  uint64_t uVar7;
  uint uVar8;
  uint32_t x;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uchar *in_R8;
  iterator pvVar13;
  iterator in_R9;
  iterator pvVar14;
  thread *t;
  pointer ptVar15;
  ulong uVar16;
  long lVar17;
  long in_FS_OFFSET;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  double hit_rate_fresh;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<uint256,_std::allocator<uint256>_> hashes_insert_copy;
  uint32_t n_insert;
  vector<uint256,_std::allocator<uint256>_> hashes;
  unique_lock<std::shared_mutex> l;
  shared_mutex mtx;
  unique_lock<std::shared_mutex> l_1;
  char *pcVar30;
  double local_2c8;
  double local_2a8;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined8 local_258;
  undefined1 local_250 [32];
  bit_packed_atomic_flags local_230;
  _Bit_type *local_228;
  char *local_220;
  _Bit_type *local_218;
  double local_210;
  vector<std::thread,_std::allocator<std::thread>_> local_208;
  vector<uint256,_std::allocator<uint256>_> local_1e8;
  uint local_1cc;
  undefined1 local_1c8 [16];
  pointer local_1b8;
  undefined8 *local_1b0;
  assertion_result local_1a8;
  undefined8 **local_190;
  undefined1 local_188 [24];
  assertion_result local_170;
  unique_lock<std::shared_mutex> local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined1 local_108 [40];
  _Bit_iterator_base local_e0;
  _Bit_iterator_base local_d0;
  undefined1 local_c0 [16];
  uint8_t local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_80 [8];
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  vector<uint256,_std::allocator<uint256>_> *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BasicTestingSetup,ZEROS);
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (pointer)0x0;
  local_108._16_8_ = (pointer)0x0;
  local_108._24_4_ = 0;
  local_108._0_8_ = (uchar *)0x0;
  local_108._8_4_ = 0;
  local_108._12_4_ = 0;
  local_108._32_8_ = operator_new__(0);
  local_e0._M_p = (_Bit_type *)0x0;
  local_e0._M_offset = 0;
  local_e0._12_4_ = 0;
  local_d0._M_p = (_Bit_type *)0x0;
  local_d0._M_offset = 0;
  local_d0._12_4_ = 0;
  local_c0 = (undefined1  [16])0x0;
  local_b0 = '\0';
  uVar16 = megabytes << 0xf;
  uVar11 = uVar16 & 0x7ffffffffff8000;
  if (0xfffffffe < uVar11) {
    uVar11 = 0xffffffff;
  }
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup
            ((cache<uint256,_SignatureCacheHasher> *)local_108,(uint32_t)uVar11);
  local_1cc = (uint)uVar16;
  std::vector<uint256,_std::allocator<uint256>_>::resize
            ((vector<uint256,_std::allocator<uint256>_> *)local_1c8,uVar16 & 0xffffffff);
  if (local_1cc != 0) {
    lVar17 = 0;
    uVar11 = 0;
    do {
      uVar6 = local_1c8._0_8_;
      lVar10 = 0;
      do {
        uVar7 = RandomMixin<FastRandomContext>::randbits<32>
                          (&(this->super_BasicTestingSetup).m_rng.
                            super_RandomMixin<FastRandomContext>);
        *(int *)((((base_blob<256U> *)uVar6)->m_data)._M_elems + lVar10 * 4 + lVar17) = (int)uVar7;
        lVar10 = lVar10 + 1;
      } while ((char)lVar10 != '\b');
      uVar11 = uVar11 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar11 < local_1cc);
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector
            (&local_1e8,(vector<uint256,_std::allocator<uint256>_> *)local_1c8);
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  local_118 = 0;
  local_78 = (mutex_type *)((ulong)local_78 & 0xffffffffffffff00);
  local_80 = (undefined1  [8])local_148;
  std::unique_lock<std::shared_mutex>::lock((unique_lock<std::shared_mutex> *)local_80);
  local_78 = (mutex_type *)CONCAT71(local_78._1_7_,true);
  if (1 < local_1cc) {
    lVar17 = 0;
    uVar11 = 0;
    do {
      puVar2 = ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + lVar17;
      local_58 = *(undefined8 *)puVar2;
      uStack_50 = *(undefined8 *)(puVar2 + 8);
      puVar3 = ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar17 + 0x10;
      local_48 = *(undefined8 *)puVar3;
      uStack_40 = *(undefined8 *)(puVar3 + 8);
      e.super_base_blob<256U>.m_data._M_elems[0x10] = (char)local_48;
      e.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)local_48 >> 8);
      e.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)local_48 >> 0x10);
      e.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)local_48 >> 0x18);
      e.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)local_48 >> 0x20);
      e.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)local_48 >> 0x28);
      e.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)local_48 >> 0x30);
      e.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)local_48 >> 0x38);
      e.super_base_blob<256U>.m_data._M_elems._0_16_ = *(undefined1 (*) [16])puVar2;
      e.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uStack_40;
      e.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)uStack_40 >> 8);
      e.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)uStack_40 >> 0x10);
      e.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)uStack_40 >> 0x18);
      e.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)uStack_40 >> 0x20);
      e.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)uStack_40 >> 0x28);
      e.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)uStack_40 >> 0x30);
      e.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)uStack_40 >> 0x38);
      CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
                ((cache<uint256,_SignatureCacheHasher> *)local_108,e);
      uVar11 = uVar11 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar11 < local_1cc >> 1);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)local_80);
  local_208.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar9 = 0;
  do {
    local_80._0_4_ = iVar9;
    local_78 = (mutex_type *)local_148;
    local_70 = (undefined1 *)&local_1cc;
    local_68 = (cache<uint256,_SignatureCacheHasher> *)local_108;
    local_60 = (vector<uint256,_std::allocator<uint256>_> *)local_1c8;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<cuckoocache_tests::EraseParallelTest::test_cache_erase_parallel<CuckooCache::cache<uint256,SignatureCacheHasher>>(unsigned_long)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)&local_208,
               (anon_class_40_5_413ab67b_for__M_head_impl *)local_80);
    iVar9 = iVar9 + 1;
  } while (iVar9 != 3);
  ptVar5 = local_208.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar15 = local_208.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start; ptVar15 != ptVar5; ptVar15 = ptVar15 + 1) {
    std::thread::join();
  }
  local_158._M_owns = false;
  local_158._M_device = (mutex_type *)local_148;
  std::unique_lock<std::shared_mutex>::lock(&local_158);
  local_158._M_owns = true;
  local_2a8 = 0.0;
  if (local_1cc == 0) {
    uVar8 = 0;
    uVar11 = 0;
  }
  else {
    uVar16 = (ulong)(local_1cc >> 1);
    lVar17 = uVar16 << 5;
    do {
      puVar2 = ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + lVar17;
      local_a8 = *(undefined8 *)puVar2;
      uStack_a0 = *(undefined8 *)(puVar2 + 8);
      puVar3 = ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar17 + 0x10;
      local_98 = *(undefined8 *)puVar3;
      uStack_90 = *(undefined8 *)(puVar3 + 8);
      e_00.super_base_blob<256U>.m_data._M_elems[0x10] = (char)local_98;
      e_00.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)local_98 >> 8);
      e_00.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)local_98 >> 0x10);
      e_00.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)local_98 >> 0x18);
      e_00.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)local_98 >> 0x20);
      e_00.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)local_98 >> 0x28);
      e_00.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)local_98 >> 0x30);
      e_00.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)local_98 >> 0x38);
      e_00.super_base_blob<256U>.m_data._M_elems._0_16_ = *(undefined1 (*) [16])puVar2;
      e_00.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uStack_90;
      e_00.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)uStack_90 >> 8);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)uStack_90 >> 0x10);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)uStack_90 >> 0x18);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)uStack_90 >> 0x20);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)uStack_90 >> 0x28);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)uStack_90 >> 0x30);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)uStack_90 >> 0x38);
      CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
                ((cache<uint256,_SignatureCacheHasher> *)local_108,e_00);
      uVar16 = uVar16 + 1;
      uVar11 = (ulong)local_1cc;
      lVar17 = lVar17 + 0x20;
    } while (uVar16 < uVar11);
    uVar8 = local_1cc >> 2;
    if (3 < local_1cc) {
      uVar16 = (ulong)(uint)local_108._24_4_;
      in_R8 = (uchar *)0x0;
      in_R9 = (iterator)0x0;
      do {
        puVar1 = (pointer)(local_1c8._0_8_ + in_R8 * 0x20);
        local_80._4_4_ =
             (int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->super_base_blob<256U>).
                             m_data._M_elems + 4) * uVar16 >> 0x20);
        local_80._0_4_ =
             (int)(*(uint *)(((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->super_base_blob<256U>).
                            m_data._M_elems * uVar16 >> 0x20);
        local_78 = (mutex_type *)
                   CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->
                                            super_base_blob<256U>).m_data._M_elems + 0xc) * uVar16
                                 >> 0x20),
                            (int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->
                                            super_base_blob<256U>).m_data._M_elems + 8) * uVar16 >>
                                 0x20));
        local_70 = (undefined1 *)
                   CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->
                                            super_base_blob<256U>).m_data._M_elems + 0x14) * uVar16
                                 >> 0x20),
                            (int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->
                                            super_base_blob<256U>).m_data._M_elems + 0x10) * uVar16
                                 >> 0x20));
        local_68 = (cache<uint256,_SignatureCacheHasher> *)
                   CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->
                                            super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar16
                                 >> 0x20),
                            (int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->
                                            super_base_blob<256U>).m_data._M_elems + 0x18) * uVar16
                                 >> 0x20));
        lVar17 = 0;
        do {
          puVar2 = (uchar *)(local_108._0_8_ + (ulong)*(uint *)(local_80 + lVar17) * 0x20);
          auVar24[0] = -(*puVar2 == (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
          auVar24[1] = -(puVar2[1] == (puVar1->super_base_blob<256U>).m_data._M_elems[1]);
          auVar24[2] = -(puVar2[2] == (puVar1->super_base_blob<256U>).m_data._M_elems[2]);
          auVar24[3] = -(puVar2[3] == (puVar1->super_base_blob<256U>).m_data._M_elems[3]);
          auVar24[4] = -(puVar2[4] == (puVar1->super_base_blob<256U>).m_data._M_elems[4]);
          auVar24[5] = -(puVar2[5] == (puVar1->super_base_blob<256U>).m_data._M_elems[5]);
          auVar24[6] = -(puVar2[6] == (puVar1->super_base_blob<256U>).m_data._M_elems[6]);
          auVar24[7] = -(puVar2[7] == (puVar1->super_base_blob<256U>).m_data._M_elems[7]);
          auVar24[8] = -(puVar2[8] == (puVar1->super_base_blob<256U>).m_data._M_elems[8]);
          auVar24[9] = -(puVar2[9] == (puVar1->super_base_blob<256U>).m_data._M_elems[9]);
          auVar24[10] = -(puVar2[10] == (puVar1->super_base_blob<256U>).m_data._M_elems[10]);
          auVar24[0xb] = -(puVar2[0xb] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar24[0xc] = -(puVar2[0xc] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar24[0xd] = -(puVar2[0xd] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar24[0xe] = -(puVar2[0xe] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar24[0xf] = -(puVar2[0xf] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xf]);
          puVar2 = (uchar *)(local_108._0_8_ + (ulong)*(uint *)(local_80 + lVar17) * 0x20 + 0x10);
          auVar27[0] = -(*puVar2 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x10]);
          auVar27[1] = -(puVar2[1] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x11]);
          auVar27[2] = -(puVar2[2] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x12]);
          auVar27[3] = -(puVar2[3] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x13]);
          auVar27[4] = -(puVar2[4] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x14]);
          auVar27[5] = -(puVar2[5] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x15]);
          auVar27[6] = -(puVar2[6] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x16]);
          auVar27[7] = -(puVar2[7] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x17]);
          auVar27[8] = -(puVar2[8] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x18]);
          auVar27[9] = -(puVar2[9] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x19]);
          auVar27[10] = -(puVar2[10] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1a]);
          auVar27[0xb] = -(puVar2[0xb] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1b]);
          auVar27[0xc] = -(puVar2[0xc] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1c]);
          auVar27[0xd] = -(puVar2[0xd] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1d]);
          auVar27[0xe] = -(puVar2[0xe] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1e]);
          auVar27[0xf] = -(puVar2[0xf] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1f]);
          auVar27 = auVar27 & auVar24;
          bVar18 = (ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff;
          if (bVar18) break;
          bVar19 = lVar17 != 0x1c;
          lVar17 = lVar17 + 4;
        } while (bVar19);
        in_R9 = in_R9 + bVar18;
        in_R8 = (uchar *)((long)in_R8 + 1);
      } while (in_R8 != (uchar *)(ulong)uVar8);
      auVar20._8_4_ = (int)((ulong)in_R9 >> 0x20);
      auVar20._0_8_ = in_R9;
      auVar20._12_4_ = 0x45300000;
      local_2c8 = (auVar20._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)in_R9) - 4503599627370496.0);
      goto LAB_0036c068;
    }
  }
  local_2c8 = 0.0;
LAB_0036c068:
  uVar16 = uVar11 >> 1;
  if (uVar8 < (uint)uVar16) {
    uVar12 = (ulong)(uint)local_108._24_4_;
    in_R9 = (iterator)(uVar11 >> 2);
    iVar9 = (int)in_R9;
    lVar17 = 0;
    do {
      puVar1 = (pointer)(local_1c8._0_8_ + in_R9 * 0x20);
      local_80._4_4_ =
           (int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R9 * 0x20))->super_base_blob<256U>).
                           m_data._M_elems + 4) * uVar12 >> 0x20);
      local_80._0_4_ =
           (int)(*(uint *)(((pointer)(local_1c8._0_8_ + in_R9 * 0x20))->super_base_blob<256U>).
                          m_data._M_elems * uVar12 >> 0x20);
      local_78 = (mutex_type *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R9 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0xc) * uVar12 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R9 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 8) * uVar12 >>
                               0x20));
      local_70 = (undefined1 *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R9 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x14) * uVar12 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R9 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x10) * uVar12 >>
                               0x20));
      local_68 = (cache<uint256,_SignatureCacheHasher> *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R9 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar12 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R9 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x18) * uVar12 >>
                               0x20));
      lVar10 = 0;
      do {
        puVar2 = (uchar *)(local_108._0_8_ + (ulong)*(uint *)(local_80 + lVar10) * 0x20);
        auVar25[0] = -(*puVar2 == (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
        auVar25[1] = -(puVar2[1] == (puVar1->super_base_blob<256U>).m_data._M_elems[1]);
        auVar25[2] = -(puVar2[2] == (puVar1->super_base_blob<256U>).m_data._M_elems[2]);
        auVar25[3] = -(puVar2[3] == (puVar1->super_base_blob<256U>).m_data._M_elems[3]);
        auVar25[4] = -(puVar2[4] == (puVar1->super_base_blob<256U>).m_data._M_elems[4]);
        auVar25[5] = -(puVar2[5] == (puVar1->super_base_blob<256U>).m_data._M_elems[5]);
        auVar25[6] = -(puVar2[6] == (puVar1->super_base_blob<256U>).m_data._M_elems[6]);
        auVar25[7] = -(puVar2[7] == (puVar1->super_base_blob<256U>).m_data._M_elems[7]);
        auVar25[8] = -(puVar2[8] == (puVar1->super_base_blob<256U>).m_data._M_elems[8]);
        auVar25[9] = -(puVar2[9] == (puVar1->super_base_blob<256U>).m_data._M_elems[9]);
        auVar25[10] = -(puVar2[10] == (puVar1->super_base_blob<256U>).m_data._M_elems[10]);
        auVar25[0xb] = -(puVar2[0xb] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xb]);
        auVar25[0xc] = -(puVar2[0xc] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xc]);
        auVar25[0xd] = -(puVar2[0xd] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xd]);
        auVar25[0xe] = -(puVar2[0xe] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xe]);
        auVar25[0xf] = -(puVar2[0xf] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xf]);
        puVar2 = (uchar *)(local_108._0_8_ + (ulong)*(uint *)(local_80 + lVar10) * 0x20 + 0x10);
        auVar28[0] = -(*puVar2 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x10]);
        auVar28[1] = -(puVar2[1] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x11]);
        auVar28[2] = -(puVar2[2] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x12]);
        auVar28[3] = -(puVar2[3] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x13]);
        auVar28[4] = -(puVar2[4] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x14]);
        auVar28[5] = -(puVar2[5] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x15]);
        auVar28[6] = -(puVar2[6] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x16]);
        auVar28[7] = -(puVar2[7] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x17]);
        auVar28[8] = -(puVar2[8] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x18]);
        auVar28[9] = -(puVar2[9] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x19]);
        auVar28[10] = -(puVar2[10] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1a]);
        auVar28[0xb] = -(puVar2[0xb] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1b]);
        auVar28[0xc] = -(puVar2[0xc] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1c]);
        auVar28[0xd] = -(puVar2[0xd] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1d]);
        auVar28[0xe] = -(puVar2[0xe] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1e]);
        auVar28[0xf] = -(puVar2[0xf] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1f]);
        auVar28 = auVar28 & auVar25;
        bVar18 = (ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff;
        if (bVar18) break;
        bVar19 = lVar10 != 0x1c;
        lVar10 = lVar10 + 4;
      } while (bVar19);
      lVar17 = lVar17 + (ulong)bVar18;
      in_R9 = in_R9 + 1;
    } while (in_R9 != (iterator)(ulong)((iVar9 + (uint)uVar16) - uVar8));
    auVar21._8_4_ = (int)((ulong)lVar17 >> 0x20);
    auVar21._0_8_ = lVar17;
    auVar21._12_4_ = 0x45300000;
    local_2a8 = (auVar21._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0);
    in_R8 = (uchar *)local_108._0_8_;
  }
  if ((int)uVar11 == 0) {
    dVar23 = 0.0;
  }
  else {
    uVar12 = (ulong)(uint)local_108._24_4_;
    in_R8 = (uchar *)0x0;
    do {
      puVar1 = (pointer)(local_1c8._0_8_ + uVar16 * 0x20);
      local_80._4_4_ =
           (int)(*(uint *)((((pointer)(local_1c8._0_8_ + uVar16 * 0x20))->super_base_blob<256U>).
                           m_data._M_elems + 4) * uVar12 >> 0x20);
      local_80._0_4_ =
           (int)(*(uint *)(((pointer)(local_1c8._0_8_ + uVar16 * 0x20))->super_base_blob<256U>).
                          m_data._M_elems * uVar12 >> 0x20);
      local_78 = (mutex_type *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + uVar16 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0xc) * uVar12 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + uVar16 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 8) * uVar12 >>
                               0x20));
      local_70 = (undefined1 *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + uVar16 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x14) * uVar12 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + uVar16 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x10) * uVar12 >>
                               0x20));
      local_68 = (cache<uint256,_SignatureCacheHasher> *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + uVar16 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar12 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + uVar16 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x18) * uVar12 >>
                               0x20));
      pvVar13 = (iterator)0x0;
      do {
        puVar2 = (uchar *)(local_108._0_8_ + (ulong)*(uint *)(local_80 + (long)pvVar13) * 0x20);
        auVar26[0] = -(*puVar2 == (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
        auVar26[1] = -(puVar2[1] == (puVar1->super_base_blob<256U>).m_data._M_elems[1]);
        auVar26[2] = -(puVar2[2] == (puVar1->super_base_blob<256U>).m_data._M_elems[2]);
        auVar26[3] = -(puVar2[3] == (puVar1->super_base_blob<256U>).m_data._M_elems[3]);
        auVar26[4] = -(puVar2[4] == (puVar1->super_base_blob<256U>).m_data._M_elems[4]);
        auVar26[5] = -(puVar2[5] == (puVar1->super_base_blob<256U>).m_data._M_elems[5]);
        auVar26[6] = -(puVar2[6] == (puVar1->super_base_blob<256U>).m_data._M_elems[6]);
        auVar26[7] = -(puVar2[7] == (puVar1->super_base_blob<256U>).m_data._M_elems[7]);
        auVar26[8] = -(puVar2[8] == (puVar1->super_base_blob<256U>).m_data._M_elems[8]);
        auVar26[9] = -(puVar2[9] == (puVar1->super_base_blob<256U>).m_data._M_elems[9]);
        auVar26[10] = -(puVar2[10] == (puVar1->super_base_blob<256U>).m_data._M_elems[10]);
        auVar26[0xb] = -(puVar2[0xb] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xb]);
        auVar26[0xc] = -(puVar2[0xc] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xc]);
        auVar26[0xd] = -(puVar2[0xd] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xd]);
        auVar26[0xe] = -(puVar2[0xe] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xe]);
        auVar26[0xf] = -(puVar2[0xf] == (puVar1->super_base_blob<256U>).m_data._M_elems[0xf]);
        puVar2 = (uchar *)(local_108._0_8_ +
                          (ulong)*(uint *)(local_80 + (long)pvVar13) * 0x20 + 0x10);
        auVar29[0] = -(*puVar2 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x10]);
        auVar29[1] = -(puVar2[1] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x11]);
        auVar29[2] = -(puVar2[2] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x12]);
        auVar29[3] = -(puVar2[3] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x13]);
        auVar29[4] = -(puVar2[4] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x14]);
        auVar29[5] = -(puVar2[5] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x15]);
        auVar29[6] = -(puVar2[6] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x16]);
        auVar29[7] = -(puVar2[7] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x17]);
        auVar29[8] = -(puVar2[8] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x18]);
        auVar29[9] = -(puVar2[9] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x19]);
        auVar29[10] = -(puVar2[10] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1a]);
        auVar29[0xb] = -(puVar2[0xb] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1b]);
        auVar29[0xc] = -(puVar2[0xc] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1c]);
        auVar29[0xd] = -(puVar2[0xd] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1d]);
        auVar29[0xe] = -(puVar2[0xe] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1e]);
        auVar29[0xf] = -(puVar2[0xf] == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1f]);
        auVar29 = auVar29 & auVar26;
        bVar18 = (ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) == 0xffff;
        in_R9 = pvVar13;
        if (bVar18) break;
        in_R9 = pvVar13 + 4;
        bVar19 = pvVar13 != (iterator)0x1c;
        pvVar13 = in_R9;
      } while (bVar19);
      in_R8 = (((pointer)in_R8)->super_base_blob<256U>).m_data._M_elems + bVar18;
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar11);
    auVar22._8_4_ = (int)((ulong)in_R8 >> 0x20);
    auVar22._0_8_ = in_R8;
    auVar22._12_4_ = 0x45300000;
    dVar23 = (auVar22._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)in_R8) - 4503599627370496.0);
  }
  dVar23 = dVar23 / ((double)uVar11 * 0.5);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_218 = (_Bit_type *)0xe858bd;
  local_230.mem._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
       (unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
       )&boost::unit_test::basic_cstring<char_const>::null;
  local_228 = (_Bit_type *)&boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x10f;
  file.m_begin = local_250 + 0x30;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)in_R8;
  local_210 = dVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)(local_250 + 0x20),
             msg);
  local_250._8_8_ = local_250._8_8_ & 0xffffffffffffff00;
  local_250._0_8_ = &PTR__lazy_ostream_013ae088;
  local_250._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_250._24_8_ = "";
  local_1b0 = &local_258;
  local_258 = 0x3ff0000000000000;
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(dVar23 == 1.0);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_188._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_188._16_8_ = "";
  local_188._0_8_ = &local_210;
  local_68 = (cache<uint256,_SignatureCacheHasher> *)local_188;
  local_78 = (mutex_type *)((ulong)local_78 & 0xffffffffffffff00);
  local_80 = (undefined1  [8])&PTR__lazy_ostream_013af9b0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_190 = &local_1b0;
  local_1a8.m_message.px = (element_type *)((ulong)local_1a8.m_message.px & 0xffffffffffffff00);
  local_1a8._0_8_ = &PTR__lazy_ostream_013af9b0;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar30 = "hit_rate_fresh";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)local_250,1,2,REQUIRE,0xe859ca,(size_t)(local_188 + 8),0x10f
             ,local_80,"1.0",&local_1a8);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x112;
  file_00.m_begin = (iterator)&local_268;
  msg_00.m_end = pvVar14;
  msg_00.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
             msg_00);
  dVar23 = (double)uVar11 * 0.25;
  local_2c8 = local_2c8 / dVar23;
  local_1a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_2c8 + local_2c8 < local_2a8 / dVar23);
  local_1a8.m_message.px = (element_type *)0x0;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_250._0_8_ = "hit_rate_stale > 2 * hit_rate_erased_but_contained";
  local_250._8_8_ = "";
  local_78 = (mutex_type *)((ulong)local_78 & 0xffffffffffffff00);
  local_80 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_280 = "";
  local_68 = (cache<uint256,_SignatureCacheHasher> *)local_250;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a8,(lazy_ostream *)local_80,1,0,WARN,(check_type)pcVar30,(size_t)&local_288,
             0x112);
  boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_158);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_208);
  if (local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0._M_p != (_Bit_type *)0x0) {
    operator_delete(local_e0._M_p,local_c0._0_8_ - (long)local_e0._M_p);
    local_e0._0_12_ = ZEXT812(0);
    local_d0._0_12_ = ZEXT812(0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_c0._8_8_;
    local_c0 = auVar4 << 0x40;
  }
  if ((_Head_base<0UL,_std::atomic<unsigned_char>_*,_false>)local_108._32_8_ !=
      (_Head_base<0UL,_std::atomic<unsigned_char>_*,_false>)0x0) {
    operator_delete__((void *)local_108._32_8_);
  }
  local_108._32_8_ =
       (__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
        )0x0;
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,(long)local_1b8 - local_1c8._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void test_cache_erase_parallel(size_t megabytes)
{
    double load = 1;
    SeedRandomForTest(SeedRand::ZEROS);
    std::vector<uint256> hashes;
    Cache set{};
    size_t bytes = megabytes * (1 << 20);
    set.setup_bytes(bytes);
    uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));
    hashes.resize(n_insert);
    for (uint32_t i = 0; i < n_insert; ++i) {
        uint32_t* ptr = (uint32_t*)hashes[i].begin();
        for (uint8_t j = 0; j < 8; ++j)
            *(ptr++) = m_rng.rand32();
    }
    /** We make a copy of the hashes because future optimizations of the
     * cuckoocache may overwrite the inserted element, so the test is
     * "future proofed".
     */
    std::vector<uint256> hashes_insert_copy = hashes;
    std::shared_mutex mtx;

    {
        /** Grab lock to make sure we release inserts */
        std::unique_lock<std::shared_mutex> l(mtx);
        /** Insert the first half */
        for (uint32_t i = 0; i < (n_insert / 2); ++i)
            set.insert(hashes_insert_copy[i]);
    }

    /** Spin up 3 threads to run contains with erase.
     */
    std::vector<std::thread> threads;
    /** Erase the first quarter */
    for (uint32_t x = 0; x < 3; ++x)
        /** Each thread is emplaced with x copy-by-value
        */
        threads.emplace_back([&, x] {
            std::shared_lock<std::shared_mutex> l(mtx);
            size_t ntodo = (n_insert/4)/3;
            size_t start = ntodo*x;
            size_t end = ntodo*(x+1);
            for (uint32_t i = start; i < end; ++i) {
                bool contains = set.contains(hashes[i], true);
                assert(contains);
            }
        });

    /** Wait for all threads to finish
     */
    for (std::thread& t : threads)
        t.join();
    /** Grab lock to make sure we observe erases */
    std::unique_lock<std::shared_mutex> l(mtx);
    /** Insert the second half */
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        set.insert(hashes_insert_copy[i]);

    /** elements that we marked erased but that are still there */
    size_t count_erased_but_contained = 0;
    /** elements that we did not erase but are older */
    size_t count_stale = 0;
    /** elements that were most recently inserted */
    size_t count_fresh = 0;

    for (uint32_t i = 0; i < (n_insert / 4); ++i)
        count_erased_but_contained += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 4); i < (n_insert / 2); ++i)
        count_stale += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        count_fresh += set.contains(hashes[i], false);

    double hit_rate_erased_but_contained = double(count_erased_but_contained) / (double(n_insert) / 4.0);
    double hit_rate_stale = double(count_stale) / (double(n_insert) / 4.0);
    double hit_rate_fresh = double(count_fresh) / (double(n_insert) / 2.0);

    // Check that our hit_rate_fresh is perfect
    BOOST_CHECK_EQUAL(hit_rate_fresh, 1.0);
    // Check that we have a more than 2x better hit rate on stale elements than
    // erased elements.
    BOOST_CHECK(hit_rate_stale > 2 * hit_rate_erased_but_contained);
}